

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rational.hpp
# Opt level: O1

Rational<scp::BigInt<unsigned_int,_unsigned_long>_> * __thiscall
scp::Rational<scp::BigInt<unsigned_int,_unsigned_long>_>::operator*=
          (Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *this,double x)

{
  Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *pRVar1;
  double dVar2;
  Frac<scp::BigInt<unsigned_int,_unsigned_long>_> local_58;
  
  dVar2 = floor(x);
  if ((dVar2 != x) || (NAN(dVar2) || NAN(x))) {
    Rational((Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_58,x);
    pRVar1 = operator*=(this,(Rational<scp::BigInt<unsigned_int,_unsigned_long>_> *)&local_58);
    Frac<scp::BigInt<unsigned_int,_unsigned_long>_>::~Frac(&local_58);
  }
  else {
    BigInt<unsigned_int,_unsigned_long>::BigInt
              ((BigInt<unsigned_int,_unsigned_long> *)&local_58,(long)x);
    pRVar1 = operator*=(this,(BigInt<unsigned_int,_unsigned_long> *)&local_58);
    if (local_58._vptr_Frac != (_func_int **)0x0) {
      operator_delete(local_58._vptr_Frac,
                      (long)local_58._p._values.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)local_58._vptr_Frac);
    }
  }
  return pRVar1;
}

Assistant:

constexpr Rational<TInteger>& Rational<TInteger>::operator*=(double x)
	{
		if (std::floor(x) == x)
		{
			return operator*=(TInteger(x));
		}
		else
		{
			return operator*=(Rational<TInteger>(x));
		}
	}